

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O1

void decode_nvrm_mthd_context_enable_device(nvrm_mthd_context_enable_device *m)

{
  int iVar1;
  ulong uVar2;
  
  if (m->gpu_id == 0) {
    iVar1 = _nvrm_field_enabled("gpu_id");
    if (iVar1 == 0) goto LAB_00259558;
  }
  fprintf(_stdout,"%sgpu_id: 0x%08x",nvrm_pfx,(ulong)m->gpu_id);
LAB_00259558:
  nvrm_pfx = nvrm_sep;
  uVar2 = 0;
  do {
    if (m->unk04[uVar2] != 0) {
      fprintf(_stdout,", unk04[%d]: 0x%08x ",uVar2 & 0xffffffff);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x20);
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_context_enable_device(struct nvrm_mthd_context_enable_device *m)
{
	int j;
	nvrm_print_x32(m, gpu_id);
	for (j = 0; j < 32; ++j)
		if (m->unk04[j] != 0)
			mmt_log_cont(", unk04[%d]: 0x%08x ", j, m->unk04[j]);
	nvrm_print_ln();
}